

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O2

void __thiscall cmCTestUpdateCommand::~cmCTestUpdateCommand(cmCTestUpdateCommand *this)

{
  cmCTestHandlerCommand::~cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  operator_delete(this,0xa8);
  return;
}

Assistant:

cmCTestUpdateCommand() {}